

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O2

void cmime_base64_decode_file(FILE *infile,FILE *outfile)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  char local_37 [4];
  byte local_33 [4];
  uchar in [4];
  uchar out [3];
  
  do {
    iVar1 = feof((FILE *)infile);
    if (iVar1 != 0) {
      return;
    }
    lVar4 = 0;
    iVar1 = 0;
    while ((lVar4 != 4 && (iVar2 = feof((FILE *)infile), iVar2 == 0))) {
      cVar6 = '\0';
      while ((iVar2 = feof((FILE *)infile), iVar2 == 0 && (cVar6 == '\0'))) {
        uVar3 = getc((FILE *)infile);
        cVar6 = '\0';
        if ((0xffffffaf < (uVar3 & 0xff) - 0x7b) &&
           (cVar6 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                    [(uVar3 & 0xff) - 0x2b] + -0x3d,
           "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
           [(uVar3 & 0xff) - 0x2b] == '$')) {
          cVar6 = '\0';
        }
      }
      iVar2 = feof((FILE *)infile);
      if (iVar2 == 0) {
        iVar1 = iVar1 + 1;
        if (cVar6 != '\0') {
          cVar6 = cVar6 + -1;
          goto LAB_0010a3fb;
        }
      }
      else {
        cVar6 = '\0';
LAB_0010a3fb:
        local_37[lVar4] = cVar6;
      }
      lVar4 = lVar4 + 1;
    }
    if (iVar1 != 0) {
      local_33[0] = (byte)local_37[1] >> 4 | local_37[0] << 2;
      local_33[1] = (byte)local_37[2] >> 2 | local_37[1] << 4;
      local_33[2] = local_37[2] << 6 | local_37[3];
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      for (uVar5 = 0; iVar1 - 1 != uVar5; uVar5 = uVar5 + 1) {
        putc((uint)local_33[uVar5],(FILE *)outfile);
      }
    }
  } while( true );
}

Assistant:

void cmime_base64_decode_file(FILE *infile, FILE *outfile) {
    unsigned char in[4], out[3], v;
    int i, len;

    while(!feof(infile)) {
        for(len = 0, i = 0; i < 4 && !feof(infile); i++) {
            v = 0;
            while(!feof(infile) && (v == 0)) {
                v = (unsigned char) getc( infile );
                v = (unsigned char) ((v < 43 || v > 122) ? 0 : cd64[ v - 43 ]);
                if( v ) {
                    v = (unsigned char) ((v == '$') ? 0 : v - 61);
                }
            }
            
            if(!feof(infile)) {
                len++;
                if(v) {
                    in[ i ] = (unsigned char) (v - 1);
                }
            } else {
                in[i] = 0;
            }
        }
        if(len) {
            cmime_base64_decode_block(in, out);
            for(i = 0; i < len - 1; i++) {
                putc(out[i], outfile);
            }
    }
    }
}